

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawPartialWarpedDecal
          (PixelGameEngine *this,Decal *decal,vf2d *pos,vf2d *source_pos,vf2d *source_size,
          Pixel *tint)

{
  undefined1 auVar1 [16];
  int i;
  long lVar2;
  ulong uVar3;
  undefined4 uVar4;
  vf2d *pvVar5;
  int iVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  v2d_generic<float> vVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float d [4];
  undefined1 local_a0 [32];
  pointer pvStack_80;
  pointer local_78;
  pointer pvStack_70;
  pointer local_68;
  pointer pfStack_60;
  pointer local_58;
  pointer pPStack_50;
  pointer local_48;
  pointer pPStack_40;
  undefined8 local_38;
  
  local_48 = (pointer)0x0;
  pPStack_40 = (pointer)0x0;
  local_58 = (pointer)0x0;
  pPStack_50 = (pointer)0x0;
  local_68 = (pointer)0x0;
  pfStack_60 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pvStack_70 = (pointer)0x0;
  local_a0._24_8_ = (pointer)0x0;
  pvStack_80 = (pointer)0x0;
  local_a0._8_8_ = (pointer)0x0;
  local_a0._16_8_ = (pointer)0x0;
  local_38._0_4_ = NORMAL;
  local_38._4_4_ = 4;
  d[1] = (float)(tint->field_0).n;
  d[0] = d[1];
  d[3] = d[1];
  d[2] = d[1];
  pvVar5 = source_pos;
  local_a0._0_8_ = decal;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)&pPStack_50,d);
  uVar4 = SUB84(pvVar5,0);
  d[0] = 1.0;
  d[1] = 1.0;
  d[2] = 1.0;
  d[3] = 1.0;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>
            ((vector<float,std::allocator<float>> *)&local_68,d);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)
             (local_a0 + 8),4);
  d[0] = 0.0;
  d[1] = 0.0;
  d[2] = 0.0;
  d[3] = 1.0;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>
            ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)&pvStack_80,
             d);
  fVar8 = (pos[3].y - pos[1].y) * (pos[2].x - pos->x) - (pos[2].y - pos->y) * (pos[3].x - pos[1].x);
  if ((fVar8 != 0.0) || (NAN(fVar8))) {
    d[0] = (*source_pos).x * (decal->vUVScale).x;
    fVar7 = (decal->vUVScale).y;
    d[1] = (*source_pos).y * fVar7;
    d[3] = (*source_size).y * fVar7 + d[1];
    d[2] = d[0];
    std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
    _M_assign_aux<olc::v2d_generic<float>const*>
              ((vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> *)
               &pvStack_80,d);
    fVar7 = pos->x;
    fVar9 = pos->y;
    fVar11 = pos[2].x - fVar7;
    fVar14 = pos[1].x;
    fVar10 = pos[1].y;
    fVar15 = fVar9 - fVar10;
    fVar16 = fVar7 - fVar14;
    fVar12 = pos[2].y - fVar9;
    fVar10 = (1.0 / fVar8) * (fVar15 * (pos[3].x - fVar14) - fVar16 * (pos[3].y - fVar10));
    fVar15 = (1.0 / fVar8) * (fVar11 * fVar15 - fVar16 * fVar12);
    fVar8 = 0.0;
    iVar6 = -(uint)(1.0 < fVar15);
    auVar1._4_4_ = -(uint)(1.0 < fVar10);
    auVar1._0_4_ = -(uint)(1.0 < fVar10);
    auVar1._8_4_ = iVar6;
    auVar1._12_4_ = iVar6;
    uVar4 = movmskpd(uVar4,auVar1);
    fVar14 = 0.0;
    if (((fVar15 < 0.0 | (byte)uVar4 >> 1 | fVar10 < 0.0 | (byte)uVar4) & 1) == 0) {
      fVar8 = fVar7 + fVar11 * fVar10;
      fVar14 = fVar9 + fVar12 * fVar10;
    }
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      fVar7 = pos[lVar2].x - fVar8;
      fVar9 = pos[lVar2].y - fVar14;
      d[lVar2] = SQRT(fVar7 * fVar7 + fVar9 * fVar9);
    }
    for (uVar3 = 0; uVar3 != 4; uVar3 = uVar3 + 1) {
      fVar8 = d[uVar3];
      if ((fVar8 != 0.0) || (fVar7 = 1.0, NAN(fVar8))) {
        fVar7 = (fVar8 + d[uVar3 ^ 2]) / d[uVar3 ^ 2];
      }
      vVar13.x = fVar7 * pvStack_80[uVar3].x;
      vVar13.y = fVar7 * pvStack_80[uVar3].y;
      pvStack_80[uVar3] = vVar13;
      local_68[uVar3] = fVar7 * local_68[uVar3];
      fVar8 = pos[uVar3].x * (this->vInvScreenSize).x;
      fVar7 = pos[uVar3].y * (this->vInvScreenSize).y;
      ((pointer)(local_a0._8_8_ + uVar3 * 8))->x = fVar8 + fVar8 + -1.0;
      ((pointer)(local_a0._8_8_ + uVar3 * 8))->y = -(fVar7 + fVar7 + -1.0);
    }
    local_38._0_4_ = this->nDecalMode;
    std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
              (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
                _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
               (value_type *)local_a0);
  }
  DecalInstance::~DecalInstance((DecalInstance *)local_a0);
  return;
}

Assistant:

void PixelGameEngine::DrawPartialWarpedDecal(olc::Decal *decal, const olc::vf2d *pos, const olc::vf2d &source_pos, const olc::vf2d &source_size, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.points = 4;
		di.decal = decal;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.uv = {{0.0f, 0.0f}, {0.0f, 1.0f}, {1.0f, 1.0f}, {1.0f, 0.0f}};
		olc::vf2d center;
		float rd = ((pos[2].x - pos[0].x) * (pos[3].y - pos[1].y) - (pos[3].x - pos[1].x) * (pos[2].y - pos[0].y));
		if (rd != 0)
		{
			olc::vf2d uvtl = source_pos * decal->vUVScale;
			olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
			di.uv = {{uvtl.x, uvtl.y}, {uvtl.x, uvbr.y}, {uvbr.x, uvbr.y}, {uvbr.x, uvtl.y}};

			rd = 1.0f / rd;
			float rn = ((pos[3].x - pos[1].x) * (pos[0].y - pos[1].y) - (pos[3].y - pos[1].y) * (pos[0].x - pos[1].x)) * rd;
			float sn = ((pos[2].x - pos[0].x) * (pos[0].y - pos[1].y) - (pos[2].y - pos[0].y) * (pos[0].x - pos[1].x)) * rd;
			if (!(rn < 0.f || rn > 1.f || sn < 0.f || sn > 1.f))
				center = pos[0] + rn * (pos[2] - pos[0]);
			float d[4];
			for (int i = 0; i < 4; i++)
				d[i] = (pos[i] - center).mag();
			for (int i = 0; i < 4; i++)
			{
				float q = d[i] == 0.0f ? 1.0f : (d[i] + d[(i + 2) & 3]) / d[(i + 2) & 3];
				di.uv[i] *= q;
				di.w[i] *= q;
				di.pos[i] = {(pos[i].x * vInvScreenSize.x) * 2.0f - 1.0f, ((pos[i].y * vInvScreenSize.y) * 2.0f - 1.0f) * -1.0f};
			}
			di.mode = nDecalMode;
			vLayers[nTargetLayer].vecDecalInstance.push_back(di);
		}
	}